

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O3

FT_Error cff_get_cmap_info(FT_CharMap charmap,TT_CMapInfo *cmap_info)

{
  FT_Error FVar1;
  FT_Module module;
  undefined8 *puVar2;
  
  FVar1 = 0x96;
  if (charmap[1].face != (FT_Face)&cff_cmap_unicode_class_rec &&
      charmap[1].face != (FT_Face)&cff_cmap_encoding_class_rec) {
    module = FT_Get_Module((charmap->face->driver->root).library,"sfnt");
    puVar2 = (undefined8 *)ft_module_get_service(module,"tt-cmaps",'\0');
    FVar1 = 0;
    if ((puVar2 != (undefined8 *)0x0) && (FVar1 = 0, (code *)*puVar2 != (code *)0x0)) {
      FVar1 = (*(code *)*puVar2)(charmap,cmap_info);
      return FVar1;
    }
  }
  return FVar1;
}

Assistant:

static FT_Error
  cff_get_cmap_info( FT_CharMap    charmap,
                     TT_CMapInfo  *cmap_info )
  {
    FT_CMap   cmap  = FT_CMAP( charmap );
    FT_Error  error = FT_Err_Ok;

    FT_Face     face    = FT_CMAP_FACE( cmap );
    FT_Library  library = FT_FACE_LIBRARY( face );


    if ( cmap->clazz != &CFF_CMAP_ENCODING_CLASS_REC_GET &&
         cmap->clazz != &CFF_CMAP_UNICODE_CLASS_REC_GET  )
    {
      FT_Module           sfnt    = FT_Get_Module( library, "sfnt" );
      FT_Service_TTCMaps  service =
        (FT_Service_TTCMaps)ft_module_get_service( sfnt,
                                                   FT_SERVICE_ID_TT_CMAP,
                                                   0 );


      if ( service && service->get_cmap_info )
        error = service->get_cmap_info( charmap, cmap_info );
    }
    else
      error = FT_THROW( Invalid_CharMap_Format );

    return error;
  }